

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O2

bool IsFile(string *path)

{
  int iVar1;
  stat st;
  stat64 local_a0;
  
  memset(&local_a0,0,0x90);
  iVar1 = stat64((path->_M_dataplus)._M_p,&local_a0);
  return (local_a0.st_mode & 0xf000) == 0x8000 && iVar1 == 0;
}

Assistant:

bool IsFile(const std::string& path)
{
#ifdef _WIN32
    WIN32_FILE_ATTRIBUTE_DATA wfad;
    return GetFileAttributesEx(path.c_str(), GetFileExInfoStandard, &wfad) &&
        !(wfad.dwFileAttributes & FILE_ATTRIBUTE_DIRECTORY);
#else
    struct stat st = {};
    return stat(path.c_str(), &st) == 0 && S_ISREG(st.st_mode);
#endif
}